

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxboundflippingrt.hpp
# Opt level: O2

bool __thiscall
soplex::
SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::getData(SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *val,int *leaveIdx,int idx,
         number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
         *stab,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *degeneps,
         number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
         *upd,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *vec,
         number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
         *low,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *upp,BreakpointSource src,
         number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
         max)

{
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar1;
  type_conflict5 tVar2;
  type_conflict5 tVar3;
  bool bVar4;
  Status SVar5;
  long lVar6;
  long lVar7;
  cpp_dec_float<200U,_int,_void> *v;
  uint *puVar8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar9;
  cpp_dec_float<200U,_int,_void> *pcVar10;
  uint *puVar11;
  multiprecision *pmVar12;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar13;
  byte bVar14;
  int local_43c;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<200U,_int,_void> local_3b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_230;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_130;
  multiprecision local_b0 [112];
  int local_40;
  undefined1 local_3c;
  fpclass_type local_38;
  int32_t local_34;
  
  bVar14 = 0;
  lVar7 = 0x1c;
  puVar8 = (uint *)(upd + idx);
  puVar11 = (uint *)&x;
  for (lVar6 = lVar7; lVar6 != 0; lVar6 = lVar6 + -1) {
    *puVar11 = *puVar8;
    puVar8 = puVar8 + 1;
    puVar11 = puVar11 + 1;
  }
  x.m_backend.exp = upd[idx].m_backend.exp;
  x.m_backend.neg = upd[idx].m_backend.neg;
  x.m_backend.fpclass = upd[idx].m_backend.fpclass;
  x.m_backend.prec_elem = upd[idx].m_backend.prec_elem;
  puVar8 = (uint *)(upd + idx);
  pmVar12 = local_b0;
  for (; lVar7 != 0; lVar7 = lVar7 + -1) {
    *(uint *)pmVar12 = *puVar8;
    puVar8 = puVar8 + 1;
    pmVar12 = pmVar12 + 4;
  }
  local_40 = x.m_backend.exp;
  local_3c = x.m_backend.neg;
  local_38 = x.m_backend.fpclass;
  local_34 = x.m_backend.prec_elem;
  boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            (&result,local_b0,
             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)0x1c);
  tVar2 = boost::multiprecision::operator<(&result,stab);
  if (tVar2) goto LAB_0045a37e;
  *leaveIdx = idx;
  result.m_backend.fpclass = cpp_dec_float_finite;
  result.m_backend.prec_elem = 0x1c;
  result.m_backend.data._M_elems[0] = 0;
  result.m_backend.data._M_elems[1] = 0;
  result.m_backend.data._M_elems[2] = 0;
  result.m_backend.data._M_elems[3] = 0;
  result.m_backend.data._M_elems[4] = 0;
  result.m_backend.data._M_elems[5] = 0;
  result.m_backend.data._M_elems[6] = 0;
  result.m_backend.data._M_elems[7] = 0;
  result.m_backend.data._M_elems[8] = 0;
  result.m_backend.data._M_elems[9] = 0;
  result.m_backend.data._M_elems[10] = 0;
  result.m_backend.data._M_elems[0xb] = 0;
  result.m_backend.data._M_elems[0xc] = 0;
  result.m_backend.data._M_elems[0xd] = 0;
  result.m_backend.data._M_elems[0xe] = 0;
  result.m_backend.data._M_elems[0xf] = 0;
  result.m_backend.data._M_elems[0x10] = 0;
  result.m_backend.data._M_elems[0x11] = 0;
  result.m_backend.data._M_elems[0x12] = 0;
  result.m_backend.data._M_elems[0x13] = 0;
  result.m_backend.data._M_elems[0x14] = 0;
  result.m_backend.data._M_elems[0x15] = 0;
  result.m_backend.data._M_elems[0x16] = 0;
  result.m_backend.data._M_elems[0x17] = 0;
  result.m_backend.data._M_elems[0x18] = 0;
  result.m_backend.data._M_elems[0x19] = 0;
  result.m_backend.data._M_elems._104_5_ = 0;
  result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  result.m_backend.exp = 0;
  result.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            (&result.m_backend,(cpp_dec_float<200U,_int,_void> *)max.m_backend.data._M_elems._0_8_,
             &x.m_backend);
  local_3b8.data._M_elems._0_8_ = (ulong)local_3b8.data._M_elems[1] << 0x20;
  tVar3 = boost::multiprecision::operator>
                    ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&result.m_backend,(int *)&local_3b8);
  pnVar9 = low;
  if (tVar3) {
    pnVar9 = upp;
  }
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
            (&val->m_backend,&pnVar9[idx].m_backend);
  v = &vec[idx].m_backend;
  local_3b8.fpclass = cpp_dec_float_finite;
  local_3b8.prec_elem = 0x1c;
  local_3b8.data._M_elems[0] = 0;
  local_3b8.data._M_elems[1] = 0;
  local_3b8.data._M_elems[2] = 0;
  local_3b8.data._M_elems[3] = 0;
  local_3b8.data._M_elems[4] = 0;
  local_3b8.data._M_elems[5] = 0;
  local_3b8.data._M_elems[6] = 0;
  local_3b8.data._M_elems[7] = 0;
  local_3b8.data._M_elems[8] = 0;
  local_3b8.data._M_elems[9] = 0;
  local_3b8.data._M_elems[10] = 0;
  local_3b8.data._M_elems[0xb] = 0;
  local_3b8.data._M_elems[0xc] = 0;
  local_3b8.data._M_elems[0xd] = 0;
  local_3b8.data._M_elems[0xe] = 0;
  local_3b8.data._M_elems[0xf] = 0;
  local_3b8.data._M_elems[0x10] = 0;
  local_3b8.data._M_elems[0x11] = 0;
  local_3b8.data._M_elems[0x12] = 0;
  local_3b8.data._M_elems[0x13] = 0;
  local_3b8.data._M_elems[0x14] = 0;
  local_3b8.data._M_elems[0x15] = 0;
  local_3b8.data._M_elems[0x16] = 0;
  local_3b8.data._M_elems[0x17] = 0;
  local_3b8.data._M_elems[0x18] = 0;
  local_3b8.data._M_elems[0x19] = 0;
  local_3b8.data._M_elems._104_5_ = 0;
  local_3b8.data._M_elems[0x1b]._1_3_ = 0;
  local_3b8.exp = 0;
  local_3b8.neg = false;
  boost::multiprecision::default_ops::
  eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            (&local_3b8,&val->m_backend,v);
  result.m_backend.fpclass = cpp_dec_float_finite;
  result.m_backend.prec_elem = 0x1c;
  result.m_backend.data._M_elems[0] = 0;
  result.m_backend.data._M_elems[1] = 0;
  result.m_backend.data._M_elems[2] = 0;
  result.m_backend.data._M_elems[3] = 0;
  result.m_backend.data._M_elems[4] = 0;
  result.m_backend.data._M_elems[5] = 0;
  result.m_backend.data._M_elems[6] = 0;
  result.m_backend.data._M_elems[7] = 0;
  result.m_backend.data._M_elems[8] = 0;
  result.m_backend.data._M_elems[9] = 0;
  result.m_backend.data._M_elems[10] = 0;
  result.m_backend.data._M_elems[0xb] = 0;
  result.m_backend.data._M_elems[0xc] = 0;
  result.m_backend.data._M_elems[0xd] = 0;
  result.m_backend.data._M_elems[0xe] = 0;
  result.m_backend.data._M_elems[0xf] = 0;
  result.m_backend.data._M_elems[0x10] = 0;
  result.m_backend.data._M_elems[0x11] = 0;
  result.m_backend.data._M_elems[0x12] = 0;
  result.m_backend.data._M_elems[0x13] = 0;
  result.m_backend.data._M_elems[0x14] = 0;
  result.m_backend.data._M_elems[0x15] = 0;
  result.m_backend.data._M_elems[0x16] = 0;
  result.m_backend.data._M_elems[0x17] = 0;
  result.m_backend.data._M_elems[0x18] = 0;
  result.m_backend.data._M_elems[0x19] = 0;
  result.m_backend.data._M_elems._104_5_ = 0;
  result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  result.m_backend.exp = 0;
  result.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            (&result.m_backend,&local_3b8,&x.m_backend);
  pcVar10 = &result.m_backend;
  pnVar9 = val;
  for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
    (pnVar9->m_backend).data._M_elems[0] = (pcVar10->data)._M_elems[0];
    pcVar10 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar10 + (ulong)bVar14 * -8 + 4);
    pnVar9 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)pnVar9 + ((ulong)bVar14 * -2 + 1) * 4);
  }
  (val->m_backend).exp = result.m_backend.exp;
  (val->m_backend).neg = result.m_backend.neg;
  (val->m_backend).fpclass = result.m_backend.fpclass;
  (val->m_backend).prec_elem = result.m_backend.prec_elem;
  bVar4 = boost::multiprecision::operator==(upp + idx,low + idx);
  if (bVar4) {
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)val,0.0);
    pSVar1 = (this->
             super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .thesolver;
    lVar7 = 0x1c;
    pcVar10 = v;
    pnVar9 = &local_130;
    for (lVar6 = lVar7; lVar6 != 0; lVar6 = lVar6 + -1) {
      (pnVar9->m_backend).data._M_elems[0] = (pcVar10->data)._M_elems[0];
      pcVar10 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar10 + (ulong)bVar14 * -8 + 4);
      pnVar9 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((long)pnVar9 + ((ulong)bVar14 * -2 + 1) * 4);
    }
    local_130.m_backend.exp = v->exp;
    local_130.m_backend.neg = v->neg;
    local_130.m_backend.fpclass = v->fpclass;
    local_130.m_backend.prec_elem = v->prec_elem;
    SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::shiftLBbound(pSVar1,idx,&local_130);
    pSVar1 = (this->
             super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .thesolver;
    pcVar10 = v;
    pnVar9 = &local_1b0;
    for (; lVar7 != 0; lVar7 = lVar7 + -1) {
      (pnVar9->m_backend).data._M_elems[0] = (pcVar10->data)._M_elems[0];
      pcVar10 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar10 + (ulong)bVar14 * -8 + 4);
      pnVar9 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((long)pnVar9 + ((ulong)bVar14 * -2 + 1) * 4);
    }
    local_1b0.m_backend.exp = v->exp;
    local_1b0.m_backend.neg = v->neg;
    local_1b0.m_backend.fpclass = v->fpclass;
    local_1b0.m_backend.prec_elem = v->prec_elem;
    SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::shiftUBbound(pSVar1,idx,&local_1b0);
    goto LAB_0045a37e;
  }
  local_3b8.data._M_elems._0_8_ = local_3b8.data._M_elems._0_8_ & 0xffffffff00000000;
  tVar3 = boost::multiprecision::operator>
                    ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)max.m_backend.data._M_elems._0_8_,(int *)&local_3b8);
  if (tVar3) {
    pnVar9 = degeneps;
    pnVar13 = &result;
    for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
      (pnVar13->m_backend).data._M_elems[0] = (pnVar9->m_backend).data._M_elems[0];
      pnVar9 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((long)pnVar9 + ((ulong)bVar14 * -2 + 1) * 4);
      pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar13 + ((ulong)bVar14 * -2 + 1) * 4);
    }
    result.m_backend.exp = (degeneps->m_backend).exp;
    result.m_backend.neg = (degeneps->m_backend).neg;
    result.m_backend.fpclass = (degeneps->m_backend).fpclass;
    result.m_backend.prec_elem = (degeneps->m_backend).prec_elem;
    if (result.m_backend.fpclass != cpp_dec_float_finite || result.m_backend.data._M_elems[0] != 0)
    {
      result.m_backend.neg = (bool)(result.m_backend.neg ^ 1);
    }
    tVar3 = boost::multiprecision::operator<(val,&result);
    if (!tVar3) goto LAB_0045a244;
  }
  else {
LAB_0045a244:
    local_43c = 0;
    tVar3 = boost::multiprecision::operator<
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)max.m_backend.data._M_elems._0_8_,&local_43c);
    if (!tVar3) goto LAB_0045a37e;
    tVar3 = boost::multiprecision::operator>(val,degeneps);
    if (!tVar3) goto LAB_0045a37e;
  }
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)val,0.0);
  pSVar1 = (this->
           super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .thesolver;
  SVar5 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::dualStatus(&pSVar1->
                        super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ,(pSVar1->
                        super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).theBaseId.data + idx);
  if (SVar5 != D_ON_BOTH) {
    result.m_backend.fpclass = cpp_dec_float_finite;
    result.m_backend.prec_elem = 0x1c;
    result.m_backend.data._M_elems[0] = 0;
    result.m_backend.data._M_elems[1] = 0;
    result.m_backend.data._M_elems[2] = 0;
    result.m_backend.data._M_elems[3] = 0;
    result.m_backend.data._M_elems[4] = 0;
    result.m_backend.data._M_elems[5] = 0;
    result.m_backend.data._M_elems[6] = 0;
    result.m_backend.data._M_elems[7] = 0;
    result.m_backend.data._M_elems[8] = 0;
    result.m_backend.data._M_elems[9] = 0;
    result.m_backend.data._M_elems[10] = 0;
    result.m_backend.data._M_elems[0xb] = 0;
    result.m_backend.data._M_elems[0xc] = 0;
    result.m_backend.data._M_elems[0xd] = 0;
    result.m_backend.data._M_elems[0xe] = 0;
    result.m_backend.data._M_elems[0xf] = 0;
    result.m_backend.data._M_elems[0x10] = 0;
    result.m_backend.data._M_elems[0x11] = 0;
    result.m_backend.data._M_elems[0x12] = 0;
    result.m_backend.data._M_elems[0x13] = 0;
    result.m_backend.data._M_elems[0x14] = 0;
    result.m_backend.data._M_elems[0x15] = 0;
    result.m_backend.data._M_elems[0x16] = 0;
    result.m_backend.data._M_elems[0x17] = 0;
    result.m_backend.data._M_elems[0x18] = 0;
    result.m_backend.data._M_elems[0x19] = 0;
    result.m_backend.data._M_elems._104_5_ = 0;
    result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    result.m_backend.exp = 0;
    result.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              (&result.m_backend,(cpp_dec_float<200U,_int,_void> *)max.m_backend.data._M_elems._0_8_
               ,&x.m_backend);
    local_3b8.data._M_elems._0_8_ = local_3b8.data._M_elems._0_8_ & 0xffffffff00000000;
    tVar3 = boost::multiprecision::operator>
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&result.m_backend,(int *)&local_3b8);
    pSVar1 = (this->
             super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .thesolver;
    lVar7 = 0x1c;
    if (tVar3) {
      pcVar10 = v;
      pnVar9 = &local_230;
      for (; lVar7 != 0; lVar7 = lVar7 + -1) {
        (pnVar9->m_backend).data._M_elems[0] = (pcVar10->data)._M_elems[0];
        pcVar10 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar10 + (ulong)bVar14 * -8 + 4);
        pnVar9 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)((long)pnVar9 + ((ulong)bVar14 * -2 + 1) * 4);
      }
      local_230.m_backend.exp = v->exp;
      local_230.m_backend.neg = v->neg;
      local_230.m_backend.fpclass = v->fpclass;
      local_230.m_backend.prec_elem = v->prec_elem;
      SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::shiftUBbound(pSVar1,idx,&local_230);
    }
    else {
      pcVar10 = v;
      pnVar9 = &local_2b0;
      for (; lVar7 != 0; lVar7 = lVar7 + -1) {
        (pnVar9->m_backend).data._M_elems[0] = (pcVar10->data)._M_elems[0];
        pcVar10 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar10 + (ulong)bVar14 * -8 + 4);
        pnVar9 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)((long)pnVar9 + ((ulong)bVar14 * -2 + 1) * 4);
      }
      local_2b0.m_backend.exp = v->exp;
      local_2b0.m_backend.neg = v->neg;
      local_2b0.m_backend.fpclass = v->fpclass;
      local_2b0.m_backend.prec_elem = v->prec_elem;
      SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::shiftLBbound(pSVar1,idx,&local_2b0);
    }
  }
LAB_0045a37e:
  return !tVar2;
}

Assistant:

bool SPxBoundFlippingRT<R>::getData(
   R&                 val,
   int&                  leaveIdx,
   int                   idx,
   R                  stab,
   R                  degeneps,
   const R*           upd,
   const R*           vec,
   const R*           low,
   const R*           upp,
   BreakpointSource      src,
   R                  max
)
{
   assert(src == FVEC);

   R x = upd[idx];

   // skip breakpoint if it is too small
   if(spxAbs(x) < stab)
   {
      return false;
   }

   leaveIdx = idx;
   val = (max * x > 0) ? upp[idx] : low[idx];
   val = (val - vec[idx]) / x;

   if(upp[idx] == low[idx])
   {
      val = 0.0;
      this->thesolver->shiftLBbound(idx, vec[idx]);
      this->thesolver->shiftUBbound(idx, vec[idx]);
   }
   else if((max > 0 && val < -degeneps) || (max < 0 && val > degeneps))
   {
      val = 0.0;

      if(this->thesolver->dualStatus(this->thesolver->baseId(idx)) != SPxBasisBase<R>::Desc::D_ON_BOTH)
      {
         if(max * x > 0)
            this->thesolver->shiftUBbound(idx, vec[idx]);
         else
            this->thesolver->shiftLBbound(idx, vec[idx]);
      }
   }

   return true;
}